

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O3

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::startServerEncryption(TlsCryptographOpenSSL *this)

{
  QSslSocketPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QArrayData *local_70;
  int local_68;
  QChar local_60;
  QArrayData *local_58 [3];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = initSslContext(this);
  if (bVar2) {
    startHandshake(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      (**(code **)(*(long *)this + 200))(this);
      return;
    }
  }
  else {
    pQVar1 = this->d;
    QMetaObject::tr((char *)local_58,(char *)&QSslSocket::staticMetaObject,0x13bd32);
    QTlsBackendOpenSSL::getErrorsFromOpenSsl();
    QVar3.m_size = (size_t)local_58;
    QVar3.field_0.m_data = local_40;
    QString::arg_impl(QVar3,local_68,local_60);
    QTlsPrivate::TlsCryptograph::setErrorAndEmit
              ((QSslSocketPrivate *)this,(SocketError)pQVar1,(QString *)0x14);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::startServerEncryption()
{
    if (!initSslContext()) {
        Q_ASSERT(d);
        setErrorAndEmit(d, QAbstractSocket::SslInternalError,
                        QSslSocket::tr("Unable to init SSL Context: %1").arg(QTlsBackendOpenSSL::getErrorsFromOpenSsl()));
        return;
    }

    // Start connecting. This will place outgoing data in the BIO, so we
    // follow up with calling transmit().
    startHandshake();
    transmit();
}